

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_not_of(StringPiece *this,char c,size_type pos)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0xffffffffffffffff;
  if (0 < this->length_) {
    uVar2 = this->length_ - 1;
    if (pos <= uVar2) {
      uVar2 = pos;
    }
    for (; (uVar1 = 0xffffffffffffffff, -1 < (long)uVar2 && (uVar1 = uVar2, this->ptr_[uVar2] == c))
        ; uVar2 = uVar2 - 1) {
    }
  }
  return uVar1;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_not_of(char c,
                                                     size_type pos) const {
  if (length_ <= 0) return npos;

  for (stringpiece_ssize_type i =
       std::min(pos, static_cast<size_type>(length_ - 1)); i >= 0; --i) {
    if (ptr_[i] != c) {
      return i;
    }
  }
  return npos;
}